

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Options::WarningsOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,WarningsOptionParser *this)

{
  allocator<char> local_19;
  WarningsOptionParser *local_18;
  WarningsOptionParser *this_local;
  
  local_18 = this;
  this_local = (WarningsOptionParser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "Enables the named warnings. If the warnings are violated the test case is failed.\n\nAt present only one warning has been provided: NoAssertions. If this warning is enabled then any test case that completes without an assertions (CHECK, REQUIRE etc) being encountered violates the warning.\n\ne.g.:\n\n    -w NoAssertions"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "Enables the named warnings. If the warnings are violated the test case is "
                    "failed.\n"
                    "\n"
                    "At present only one warning has been provided: NoAssertions. If this warning "
                    "is enabled then any test case that completes without an assertions (CHECK, "
                    "REQUIRE etc) being encountered violates the warning.\n"
                    "\n"
                    "e.g.:\n"
                    "\n"
                    "    -w NoAssertions";
            }